

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_tbranch(DisasContext_conflict1 *s,arg_tbranch *a,_Bool half)

{
  TCGContext_conflict1 *tcg_ctx;
  undefined1 extraout_AL;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  undefined7 in_register_00000011;
  MemOp opc;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = load_reg(s,a->rm);
  if ((int)CONCAT71(in_register_00000011,half) != 0) {
    tcg_gen_add_i32(tcg_ctx,ret,ret,ret);
  }
  ret_00 = load_reg(s,a->rn);
  tcg_gen_add_i32(tcg_ctx,ret_00,ret_00,ret);
  opc = MO_8;
  if (half) {
    opc = s->be_data | MO_16;
  }
  gen_aa32_ld_i32(s,ret,ret_00,s->mmu_idx & 0xf,opc);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_gen_add_i32(tcg_ctx,ret,ret,ret);
  tcg_gen_addi_i32_aarch64(tcg_ctx,ret,ret,(int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4);
  store_reg(s,0xf,ret);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_tbranch(DisasContext *s, arg_tbranch *a, bool half)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 addr, tmp;

    tmp = load_reg(s, a->rm);
    if (half) {
        tcg_gen_add_i32(tcg_ctx, tmp, tmp, tmp);
    }
    addr = load_reg(s, a->rn);
    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp);

    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                    half ? MO_UW | s->be_data : MO_UB);
    tcg_temp_free_i32(tcg_ctx, addr);

    tcg_gen_add_i32(tcg_ctx, tmp, tmp, tmp);
    tcg_gen_addi_i32(tcg_ctx, tmp, tmp, read_pc(s));
    store_reg(s, 15, tmp);
    return true;
}